

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

ssize_t send_callback(nghttp2_session *h2,uint8_t *mem,size_t length,int flags,void *userp)

{
  Curl_easy *data;
  uint in_EAX;
  long lVar1;
  ssize_t sVar2;
  CURLcode result;
  undefined8 uStack_18;
  
  data = *(Curl_easy **)((long)userp + 0x4a0);
  uStack_18 = (ulong)in_EAX;
  sVar2 = -0x386;
  if (*(code **)((long)userp + 0x4b0) != (code *)0x0) {
    lVar1 = (**(code **)((long)userp + 0x4b0))(data,0,mem,length,(long)&uStack_18 + 4);
    sVar2 = -0x1f8;
    if (((uStack_18._4_4_ != 0x51) && (lVar1 != 0)) && (sVar2 = lVar1, lVar1 == -1)) {
      Curl_failf(data,"Failed sending HTTP2 data");
      sVar2 = -0x386;
    }
  }
  return sVar2;
}

Assistant:

static ssize_t send_callback(nghttp2_session *h2,
                             const uint8_t *mem, size_t length, int flags,
                             void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *c = &conn->proto.httpc;
  struct Curl_easy *data = get_transfer(c);
  ssize_t written;
  CURLcode result = CURLE_OK;

  (void)h2;
  (void)flags;

  if(!c->send_underlying)
    /* called before setup properly! */
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  written = ((Curl_send*)c->send_underlying)(data, FIRSTSOCKET,
                                             mem, length, &result);

  if(result == CURLE_AGAIN) {
    return NGHTTP2_ERR_WOULDBLOCK;
  }

  if(written == -1) {
    failf(data, "Failed sending HTTP2 data");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  if(!written)
    return NGHTTP2_ERR_WOULDBLOCK;

  return written;
}